

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

double __thiscall OpenMD::Vector<double,_6U>::max(Vector<double,_6U> *this)

{
  double dVar1;
  uint i;
  long lVar2;
  double dVar3;
  
  dVar3 = this->data_[0];
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    dVar1 = this->data_[lVar2];
    if (this->data_[lVar2] <= dVar3) {
      dVar1 = dVar3;
    }
    dVar3 = dVar1;
  }
  return dVar3;
}

Assistant:

inline Real max() {
      Real val = this->data_[0];
      for (unsigned int i = 0; i < Dim; i++) {
        if (this->data_[i] > val) val = this->data_[i];
      }
      return val;
    }